

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticGraphics.c
# Opt level: O3

void plot_static_tiles(tgestate_t *state,uint8_t *out,statictileline_t *stline,int orientation)

{
  byte bVar1;
  zxspectrum_t *pzVar2;
  uint uVar3;
  tile_t *ptVar4;
  uint8_t *puVar5;
  int height;
  long lVar6;
  long lVar7;
  int width;
  static_tile_t *psVar8;
  uint uVar9;
  byte *pbVar10;
  uint uVar11;
  
  pbVar10 = stline->tiles;
  uVar11 = stline->flags_and_length & 0x7f;
  puVar5 = out;
  do {
    while( true ) {
      bVar1 = *pbVar10;
      psVar8 = static_tiles + bVar1;
      lVar7 = 0;
      do {
        lVar6 = lVar7;
        ptVar4 = &psVar8->data;
        psVar8 = (static_tile_t *)((psVar8->data).row + 1);
        puVar5[lVar6] = ptVar4->row[0];
        lVar7 = lVar6 + 0x100;
      } while ((int)lVar7 != 0x800);
      pbVar10 = pbVar10 + 1;
      pzVar2 = state->speccy;
      uVar9 = ((int)puVar5 - (int)pzVar2) + 0x6d0U & 0xff;
      uVar3 = uVar9 | 0x100;
      if ((long)(puVar5 + (lVar7 - (long)pzVar2) + -0x130) < 0x800) {
        uVar3 = uVar9;
      }
      uVar9 = uVar3 + 0x100;
      if ((long)(puVar5 + (lVar7 - (long)pzVar2) + -0x130) < 0x1000) {
        uVar9 = uVar3;
      }
      uVar11 = uVar11 - 1;
      (pzVar2->screen).attributes[uVar9] = static_tiles[bVar1].attr;
      if (orientation != 0) break;
      puVar5 = puVar5 + lVar6 + -0x6ff;
      if (uVar11 == 0) {
        width = (stline->flags_and_length & 0x7f) << 3;
        height = 8;
LAB_0010cdaf:
        invalidate_bitmap(state,out,width,height);
        return;
      }
    }
    puVar5 = get_next_scanline(state,puVar5 + lVar6);
  } while (uVar11 != 0);
  height = (stline->flags_and_length & 0x7f) << 3;
  width = 8;
  goto LAB_0010cdaf;
}

Assistant:

static void plot_static_tiles(tgestate_t             *state,
                              uint8_t                *out,
                              const statictileline_t *stline,
                              int                     orientation)
{
  uint8_t       *saved_out = out;

  int            tiles_remaining; /* was A/B */
  const uint8_t *tiles;           /* was HL */

  assert(state  != NULL);
  ASSERT_SCREEN_PTR_VALID(out);
  assert(stline != NULL);
  assert(orientation == 0x00 || orientation == 0xFF);

  tiles = stline->tiles;

  tiles_remaining = stline->flags_and_length & ~statictileline_MASK;
  do
  {
    int                  tile_index;  /* was A */
    const static_tile_t *static_tile; /* was HL' */
    const tilerow_t     *tile_data;   /* was HL' */
    int                  iters;       /* was B' */
    ptrdiff_t            soffset;     /* was A */
    int                  aoffset;

    tile_index = *tiles++;

    static_tile = &static_tiles[tile_index]; // elements: 9 bytes each

    /* Plot a tile. */
    tile_data = &static_tile->data.row[0];
    iters = 8;
    do
    {
      *out = *tile_data++;
      out += 256; /* move to next screen row */
    }
    while (--iters);
    out -= 256;

    /* Calculate screen attribute address of tile. */
    // ((out - screen_base) / 0x800) * 0x100 + attr_base
    soffset = out - &state->speccy->screen.pixels[0];
    aoffset = soffset & 0xFF;
    if (soffset >= 0x0800) aoffset += 256;
    if (soffset >= 0x1000) aoffset += 256;
    state->speccy->screen.attributes[aoffset] = static_tile->attr; /* Copy attribute byte. */

    if (orientation == 0) /* Horizontal */
      out = out - 7 * 256 + 1;
    else /* Vertical */
      out = (uint8_t *) get_next_scanline(state, out); // must cast away constness

    ASSERT_SCREEN_PTR_VALID(out);
  }
  while (--tiles_remaining);

  /* Conv: Invalidation added over the original game. */
  tiles_remaining = stline->flags_and_length & ~statictileline_MASK;
  if (orientation == 0) /* Horizontal */
    invalidate_bitmap(state, saved_out, tiles_remaining * 8, 8);
  else
    invalidate_bitmap(state, saved_out, 8, tiles_remaining * 8);
}